

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::NumericToHugeDecimalCast<unsigned_char>
               (uchar input,hugeint_t *result,CastParameters *parameters,uint8_t width,uint8_t scale
               )

{
  bool bVar1;
  long lVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  uchar in_R9B;
  hugeint_t hVar3;
  hugeint_t hinput;
  string error;
  hugeint_t max_width;
  allocator local_b9;
  hugeint_t local_b8;
  hugeint_t local_a8;
  hugeint_t local_88;
  string local_70;
  string local_50 [32];
  
  lVar2 = ((CONCAT71(in_register_00000009,width) & 0xffffffff) -
          (CONCAT71(in_register_00000081,scale) & 0xffffffff)) * 0x10;
  local_88.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar2);
  local_88.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + lVar2 + 8);
  local_b8 = Hugeint::Convert<unsigned_char>(input);
  bVar1 = hugeint_t::operator>=(&local_b8,&local_88);
  if (!bVar1) {
    local_a8 = hugeint_t::operator-(&local_88);
    bVar1 = hugeint_t::operator<=(&local_b8,&local_a8);
    if (!bVar1) {
      hVar3 = hugeint_t::operator*
                        (&local_b8,
                         (hugeint_t *)
                         (Hugeint::POWERS_OF_TEN +
                         (uint)((int)CONCAT71(in_register_00000081,scale) << 4)));
      *result = hVar3;
      return true;
    }
  }
  ::std::__cxx11::string::string(local_50,"Could not cast value %s to DECIMAL(%d,%d)",&local_b9);
  hugeint_t::ToString_abi_cxx11_(&local_70,&local_b8);
  StringUtil::Format<std::__cxx11::string,unsigned_char,unsigned_char>
            ((string *)&local_a8,(StringUtil *)local_50,&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)width,scale
             ,in_R9B);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string(local_50);
  HandleCastError::AssignError((string *)&local_a8,parameters);
  ::std::__cxx11::string::~string((string *)&local_a8);
  return false;
}

Assistant:

bool NumericToHugeDecimalCast(SRC input, hugeint_t &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	hugeint_t max_width = Hugeint::POWERS_OF_TEN[width - scale];
	hugeint_t hinput = Hugeint::Convert(input);
	if (hinput >= max_width || hinput <= -max_width) {
		string error = StringUtil::Format("Could not cast value %s to DECIMAL(%d,%d)", hinput.ToString(), width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = hinput * Hugeint::POWERS_OF_TEN[scale];
	return true;
}